

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

Query * plan_qstring(Query *__return_storage_ptr__,
                    unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
                    *types_to_query,QString *value)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Query *pQVar4;
  uint uVar5;
  ulong uVar6;
  optional<unsigned_int> oVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  vector<Query,_std::allocator<Query>_> plan;
  PrimitiveQuery local_98;
  ulong local_90;
  vector<Query,_std::allocator<Query>_> local_88;
  Query *local_68;
  _Node_iterator_base<IndexType,_false> local_60;
  long local_58;
  _Node_iterator_base<IndexType,_false> local_50;
  long local_48;
  _Node_iterator_base<IndexType,_false> local_40;
  _Node_iterator_base<IndexType,_false> local_38;
  
  local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.itype = GRAM3;
  local_60._M_cur =
       (__node_type *)
       std::
       _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       ::find((_Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)types_to_query,&local_98.itype);
  local_98.itype = TEXT4;
  local_40._M_cur =
       (__node_type *)
       std::
       _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       ::find((_Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)types_to_query,&local_98.itype);
  local_98.itype = WIDE8;
  local_68 = __return_storage_ptr__;
  local_38._M_cur =
       (__node_type *)
       std::
       _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       ::find((_Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)types_to_query,&local_98.itype);
  local_98.itype = HASH4;
  local_50._M_cur =
       (__node_type *)
       std::
       _Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       ::find((_Hashtable<IndexType,_IndexType,_std::allocator<IndexType>,_std::__detail::_Identity,_std::equal_to<IndexType>,_std::hash<IndexType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)types_to_query,&local_98.itype);
  if (2 < (ulong)(((long)(value->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(value->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    local_90 = 0;
    uVar6 = 2;
    iVar10 = 0;
    do {
      iVar3 = (int)local_90;
      lVar11 = (long)(int)local_90;
      local_58 = (long)(iVar10 + -1);
      local_48 = (long)iVar10;
      lVar12 = 0;
      while( true ) {
        iVar2 = (int)lVar12;
        if ((local_38._M_cur != (__node_type *)0x0) &&
           (oVar7 = convert_gram(WIDE8,iVar2 + iVar3,value),
           ((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int> & 0x100000000) != 0)) {
          local_98.itype = WIDE8;
          local_98.trigram =
               oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload;
          std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>
                    (&local_88,&local_98);
          iVar10 = (int)local_90 + iVar2 + 6;
          local_90 = uVar6;
          goto LAB_0017a125;
        }
        iVar10 = iVar2 + iVar3;
        if ((local_40._M_cur != (__node_type *)0x0) &&
           (oVar7 = convert_gram(TEXT4,iVar10,value),
           ((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int> & 0x100000000) != 0)) break;
        oVar7 = convert_gram(HASH4,iVar10,value);
        lVar1 = lVar12 + lVar11;
        if (((local_50._M_cur != (__node_type *)0x0) && (local_58 <= lVar1)) &&
           (((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) != 0)) {
          local_98.itype = HASH4;
          local_98.trigram =
               oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload;
          std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>
                    (&local_88,&local_98);
        }
        oVar7 = convert_gram(GRAM3,iVar10,value);
        if (((local_48 <= lVar1) && (local_60._M_cur != (__node_type *)0x0)) &&
           (((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) != 0)) {
          local_98.itype = GRAM3;
          local_98.trigram =
               oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload;
          std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>
                    (&local_88,&local_98);
        }
        uVar8 = ((long)(value->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(value->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        uVar6 = (ulong)(iVar2 + iVar3 + 3);
        uVar9 = lVar12 + lVar11 + 3;
        lVar12 = lVar12 + 1;
        if (uVar8 < uVar9 || uVar8 - uVar9 == 0) goto LAB_0017a152;
      }
      local_98.itype = TEXT4;
      local_98.trigram =
           oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
      std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>(&local_88,&local_98);
      iVar10 = iVar2 + iVar3 + 2;
      local_90 = (ulong)((int)local_90 + iVar2 + 1);
LAB_0017a125:
      uVar5 = (int)local_90 + 2;
      uVar6 = (ulong)uVar5;
      uVar8 = ((long)(value->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(value->super__Vector_base<QToken,_std::allocator<QToken>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while ((ulong)(long)(int)uVar5 <= uVar8 && uVar8 - (long)(int)uVar5 != 0);
  }
LAB_0017a152:
  pQVar4 = local_68;
  local_68->type = AND;
  (local_68->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_68->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_68->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_68->ngram).itype = GRAM3;
  (local_68->ngram).trigram = 0;
  local_68->count = 0;
  (local_68->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (local_68->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (local_68->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Catch::clara::std::vector<Query,_std::allocator<Query>_>::~vector
            ((vector<Query,_std::allocator<Query>_> *)&local_88);
  return pQVar4;
}

Assistant:

Query plan_qstring(const std::unordered_set<IndexType> &types_to_query,
                   const QString &value) {
    std::vector<Query> plan;

    bool has_gram3 = types_to_query.count(IndexType::GRAM3) != 0;
    bool has_text4 = types_to_query.count(IndexType::TEXT4) != 0;
    bool has_wide8 = types_to_query.count(IndexType::WIDE8) != 0;
    bool has_hash4 = types_to_query.count(IndexType::HASH4) != 0;

    // `i` is the current index. `skip_to` is used to keep track of last
    // "handled" byte. For example there's no point in adding 3gram "bcd"
    // when 4gram "abcd" was already added. Only relevant for wide8 ngrams.
    int i = 0;
    int skip_to = 0;
    while (i + 2 < value.size()) {
        // If wide8 index is supported, try to add a token and skip 6 bytes.
        if (has_wide8) {
            if (const auto &gram = convert_gram(IndexType::WIDE8, i, value)) {
                plan.emplace_back(PrimitiveQuery(IndexType::WIDE8, *gram));
                skip_to = i + 6;
                i += 2;
                continue;
            }
        }
        // If text4 index is supported, try to add a token and skip 2 bytes.
        if (has_text4) {
            if (const auto &gram = convert_gram(IndexType::TEXT4, i, value)) {
                plan.emplace_back(PrimitiveQuery(IndexType::TEXT4, *gram));
                skip_to = i + 2;
                i += 1;
                continue;
            }
        }
        // If hash4 index is supported and current ngram is not text, try hash4.
        const auto &hgram = convert_gram(IndexType::HASH4, i, value);
        if (i >= (skip_to - 1) && has_hash4 && hgram) {
            plan.emplace_back(PrimitiveQuery(IndexType::HASH4, *hgram));
            // Don't continue here - gram3 can give us more information.
        }
        // Otherwise, add a regular gram3 token.
        const auto &gram = convert_gram(IndexType::GRAM3, i, value);
        if (i >= skip_to && gram) {
            if (has_gram3) {
                plan.emplace_back(PrimitiveQuery(IndexType::GRAM3, *gram));
            }
            i += 1;
            continue;
        }
        // If no ngram can be added, remember to move forward.
        i += 1;
    }

    return q_and(std::move(plan));
}